

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# memory_allocator_nginx_impl.c
# Opt level: O1

void * memory_allocator_nginx_reallocate
                 (memory_allocator_impl impl,void *data,size_t size,size_t new_size)

{
  void *pvVar1;
  
  pvVar1 = (void *)(**(code **)((long)impl + 8))(*impl,new_size);
  if (pvVar1 == (void *)0x0) {
    pvVar1 = (void *)0x0;
  }
  else {
    if (size < new_size) {
      new_size = size;
    }
    (**(code **)((long)impl + 0x10))(pvVar1,data,new_size);
    (**(code **)((long)impl + 0x18))(*impl,data);
  }
  return pvVar1;
}

Assistant:

void *memory_allocator_nginx_reallocate(memory_allocator_impl impl, void *data, size_t size, size_t new_size)
{
	memory_allocator_nginx_impl nginx_impl = (memory_allocator_nginx_impl)impl;

	void *new_data = nginx_impl->palloc(nginx_impl->pool, new_size);

	if (new_data == NULL)
	{
		return NULL;
	}

	if (size < new_size)
	{
		nginx_impl->pcopy(new_data, data, size);
	}
	else
	{
		nginx_impl->pcopy(new_data, data, new_size);
	}

	(void)nginx_impl->pfree(nginx_impl->pool, data);

	return new_data;
}